

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall
helics::FunctionExecutionFailure::~FunctionExecutionFailure(FunctionExecutionFailure *this)

{
  void *in_RDI;
  
  ~FunctionExecutionFailure((FunctionExecutionFailure *)0x49f918);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit FunctionExecutionFailure(
        std::string_view message = "HELICS execution failure") noexcept: HelicsException(message)
    {
    }